

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void __thiscall
gflags::anon_unknown_5::Test_FlagsValidatorDeathTest_InvalidFlagNeverSet::
Test_FlagsValidatorDeathTest_InvalidFlagNeverSet
          (Test_FlagsValidatorDeathTest_InvalidFlagNeverSet *this)

{
  value_type local_18;
  Test_FlagsValidatorDeathTest_InvalidFlagNeverSet *local_10;
  Test_FlagsValidatorDeathTest_InvalidFlagNeverSet *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(FlagsValidatorDeathTest, InvalidFlagNeverSet) {
  // If a flag keeps its default value, and that default value is
  // invalid, we should die at argv-parse time.
  const char* argv[] = {
    "my_test",
    NULL,
  };
  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  EXPECT_DEATH(ParseTestFlag(true, arraysize(argv) - 1, argv),
               "ERROR: --test_flag must be set on the commandline");
}